

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O1

UINT8 device_start_multipcm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  double dVar1;
  double dVar2;
  UINT8 UVar3;
  int iVar4;
  DEV_DATA DVar5;
  long lVar6;
  INT32 *pIVar7;
  INT32 (*paIVar8) [256];
  long lVar9;
  MultiPCM *ptChip;
  int iVar10;
  int iVar11;
  ulong uVar12;
  INT32 (*paIVar13) [256];
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  
  DVar5.chipInf = calloc(1,0x22d8);
  if ((DEV_DATA *)DVar5.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    ((DEV_DATA *)((long)DVar5.chipInf + 0x22c8))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar5.chipInf + 0x22d0))->chipInf = (void *)0x0;
    *(float *)((long)DVar5.chipInf + 0x10bc) = (float)cfg->clock / 180.0;
    if (IsInit == '\0') {
      IsInit = '\x01';
      lVar15 = 0;
      lVar9 = 0;
      do {
        dVar1 = pow(10.0,(double)(((float)(int)lVar9 * -24.0 * 0.015625) / 20.0));
        lVar6 = 0x10;
        uVar12 = 0;
        lVar14 = lVar15;
        do {
          iVar4 = (int)uVar12;
          if (iVar4 == 8) {
            fVar16 = 0.0;
            fVar17 = 0.0;
          }
          else if (iVar4 == 0) {
            fVar17 = 1.0;
            fVar16 = 1.0;
          }
          else if (uVar12 < 8) {
            dVar2 = pow(10.0,(double)(((float)iVar4 * -12.0 * 0.25) / 20.0));
            fVar17 = 0.0;
            if (lVar6 != 9) {
              fVar17 = (float)dVar2;
            }
            fVar16 = 1.0;
          }
          else {
            dVar2 = pow(10.0,(double)(((float)(int)(uint)lVar6 * -12.0 * 0.25) / 20.0));
            fVar16 = 0.0;
            if ((~(uint)lVar6 & 7) != 0) {
              fVar16 = (float)dVar2;
            }
            fVar17 = 1.0;
          }
          *(int *)((long)left_pan_table + lVar14) =
               (int)(long)(fVar17 * (float)dVar1 * 0.25 * 4096.0);
          *(int *)((long)right_pan_table + lVar14) =
               (int)(long)(fVar16 * (float)dVar1 * 0.25 * 4096.0);
          uVar12 = uVar12 + 1;
          lVar14 = lVar14 + 0x200;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        lVar9 = lVar9 + 1;
        lVar15 = lVar15 + 4;
      } while (lVar9 != 0x80);
      pIVar7 = linear_to_exp_volume;
      lVar9 = 0;
      do {
        dVar1 = pow(10.0,(double)(((float)(int)lVar9 * 96.0 * -0.0009765625 + 96.0) / -20.0));
        *pIVar7 = (INT32)(long)((float)dVar1 * 4096.0);
        lVar9 = lVar9 + 1;
        pIVar7 = pIVar7 + 1;
      } while (lVar9 != 0x400);
      iVar4 = 0x80;
      lVar9 = 0x200;
      lVar15 = 0;
      uVar12 = 0;
      do {
        iVar11 = (int)lVar9;
        if (uVar12 < 0x40) {
          *(int *)((long)pitch_table + lVar15) = iVar4;
        }
        else {
          if (uVar12 < 0x80) {
            iVar10 = iVar11 + -0x81;
          }
          else if (uVar12 < 0xc0) {
            iVar10 = iVar11 + -0x80;
          }
          else {
            iVar10 = iVar4 + -0x1ff;
          }
          *(int *)((long)pitch_table + lVar15) = iVar10;
        }
        iVar11 = iVar11 + -0x101;
        if (0x7f < uVar12) {
          iVar11 = iVar4 + -0x180;
        }
        *(int *)((long)amplitude_table + lVar15) = iVar11;
        uVar12 = uVar12 + 1;
        iVar4 = iVar4 + 2;
        lVar15 = lVar15 + 4;
        lVar9 = lVar9 + -2;
      } while (lVar9 != 0);
      paIVar8 = pitch_scale_tables;
      paIVar13 = amplitude_scale_tables;
      lVar9 = 0;
      do {
        fVar16 = PHASE_SCALE_LIMIT[lVar9];
        lVar15 = 0;
        do {
          dVar1 = exp2((double)(((float)((int)lVar15 + -0x80) * fVar16 * 0.0078125) / 1200.0));
          (*paIVar8)[lVar15] = (INT32)(long)((float)dVar1 * 256.0);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x100);
        fVar16 = AMPLITUDE_SCALE_LIMIT[lVar9];
        lVar15 = 0;
        do {
          dVar1 = pow(10.0,(double)(((float)(int)lVar15 * -fVar16 * 0.00390625) / 20.0));
          (*paIVar13)[lVar15] = (INT32)(long)((float)dVar1 * 256.0);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x100);
        lVar9 = lVar9 + 1;
        paIVar8 = paIVar8 + 1;
        paIVar13 = paIVar13 + 1;
      } while (lVar9 != 8);
    }
    fVar16 = *(float *)((long)DVar5.chipInf + 0x10bc);
    lVar9 = 0;
    do {
      *(int *)((long)DVar5.chipInf + lVar9 * 4 + 0x12c0) =
           (int)(long)(((float)(int)lVar9 + 1024.0) * fVar16 * 0.0009765625 * 4096.0);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x400);
    lVar9 = 0;
    do {
      dVar1 = BASE_TIMES[lVar9 + 4];
      *(int *)((long)DVar5.chipInf + lVar9 * 4 + 0x10d0) =
           (int)(long)(67108864.0 / (float)((dVar1 * 44100.0) / 1000.0));
      *(int *)((long)DVar5.chipInf + lVar9 * 4 + 0x11d0) =
           (int)(long)(67108864.0 / (float)((dVar1 * 14.32833 * 44100.0) / 1000.0));
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x3c);
    ((DEV_DATA *)((long)DVar5.chipInf + 0x10c0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar5.chipInf + 0x10c8))->chipInf = (void *)0x0;
    *(undefined4 *)((long)DVar5.chipInf + 0x11bc) = 0x4000000;
    ((DEV_DATA *)((long)DVar5.chipInf + 0x11c0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar5.chipInf + 0x11c8))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar5.chipInf + 0x22c0))->chipInf = (void *)0x4cffffff68;
    *(undefined1 *)&((DEV_DATA *)((long)DVar5.chipInf + 0x10b0))->chipInf = 0;
    *(undefined8 *)((long)DVar5.chipInf + 0x10b4) = 0;
    lVar9 = 0x98;
    do {
      *(undefined1 *)((long)DVar5.chipInf + lVar9) = 0;
      lVar9 = lVar9 + 0x98;
    } while (lVar9 != 0x1138);
    *(void **)DVar5.chipInf = DVar5.chipInf;
    fVar16 = *(float *)((long)DVar5.chipInf + 0x10bc);
    retDevInf->dataPtr = (DEV_DATA *)DVar5.chipInf;
    retDevInf->sampleRate = (UINT32)(long)fVar16;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_multipcm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	MultiPCM *ptChip;
	INT32 i;

	ptChip = (MultiPCM *)calloc(1, sizeof(MultiPCM));
	if (ptChip == NULL)
		return 0xFF;
	
	ptChip->ROM = NULL;
	ptChip->ROMSize = 0x00;
	ptChip->ROMMask = 0x00;
	ptChip->rate = (float)cfg->clock / MULTIPCM_CLOCKDIV;

	if (! IsInit)
	{
		INT32 level;

		IsInit = 1;

		// Volume + pan table
		for (level = 0; level < 0x80; ++level)
		{
			const float vol_db = (float)level * (-24.0f) / 64.0f;
			const float total_level = powf(10.0f, vol_db / 20.0f) / 4.0f;
			INT32 pan;

			for (pan = 0; pan < 0x10; ++pan)
			{
				float pan_left, pan_right;
				if (pan == 0x8)
				{
					pan_left = 0.0;
					pan_right = 0.0;
				}
				else if (pan == 0x0)
				{
					pan_left = 1.0;
					pan_right = 1.0;
				}
				else if (pan & 0x8)
				{
					const INT32 inverted_pan = 0x10 - pan;
					const float pan_vol_db = (float)inverted_pan * (-12.0f) / 4.0f;

					pan_left = 1.0;
					pan_right = powf(10.0f, pan_vol_db / 20.0f);

					if ((inverted_pan & 0x7) == 7)
						pan_right = 0.0;
				}
				else
				{
					const float pan_vol_db = (float)pan * (-12.0f) / 4.0f;

					pan_left = powf(10.0f, pan_vol_db / 20.0f);
					pan_right = 1.0;

					if ((pan & 0x7) == 7)
						pan_left = 0.0;
				}

				left_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_left * total_level);
				right_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_right * total_level);
			}
		}

		// build the linear->exponential ramps
		for(i = 0; i < 0x400; ++i)
		{
			const float db = -(96.0f - (96.0f * (float)i / (float)0x400));
			const float exp_volume = powf(10.0f, db / 20.0f);
			linear_to_exp_volume[i] = value_to_fixed(TL_SHIFT, exp_volume);
		}

		lfo_init();
	}

	//Pitch steps
	for (i = 0; i < 0x400; ++i)
	{
		const float fcent = ptChip->rate * (1024.0f + (float)i) / 1024.0f;
		ptChip->freq_step_table[i] = value_to_fixed(TL_SHIFT, fcent);
	}

	// Envelope steps
	for (i = 4; i < 0x40; ++i)
	{
		// Times are based on 44100Hz clock, adjust to real chip clock
		ptChip->attack_step[i] = (float)(0x400 << EG_SHIFT) / (float)(BASE_TIMES[i] * 44100.0 / 1000.0);
		ptChip->decay_release_step[i] = (float)(0x400 << EG_SHIFT) / (float)(BASE_TIMES[i] * attack_rate_to_decay_rate * 44100.0 / 1000.0);
	}
	ptChip->attack_step[0] = ptChip->attack_step[1] = ptChip->attack_step[2] = ptChip->attack_step[3] = 0;
	ptChip->attack_step[0x3f] = 0x400 << EG_SHIFT;
	ptChip->decay_release_step[0] = ptChip->decay_release_step[1] = ptChip->decay_release_step[2] = ptChip->decay_release_step[3] = 0;

	// Total level interpolation steps
	ptChip->total_level_steps[0] = -(float)(0x80 << TL_SHIFT) / (78.2f * 44100.0f / 1000.0f); // lower
	ptChip->total_level_steps[1] = (float)(0x80 << TL_SHIFT) / (78.2f * 2 * 44100.0f / 1000.0f); // raise

	ptChip->sega_banking = 0;
	ptChip->bank0 = ptChip->bank1 = 0x000000;

	multipcm_set_mute_mask(ptChip, 0x00);

	ptChip->_devData.chipInf = ptChip;
	INIT_DEVINF(retDevInf, &ptChip->_devData, (UINT32)ptChip->rate, &devDef);

	return 0x00;
}